

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkdatagram_p.h
# Opt level: O3

void __thiscall
QNetworkDatagramPrivate::QNetworkDatagramPrivate
          (QNetworkDatagramPrivate *this,QByteArray *data,QHostAddress *dstAddr,quint16 port)

{
  Data *pDVar1;
  
  pDVar1 = (data->d).d;
  (this->data).d.d = pDVar1;
  (this->data).d.ptr = (data->d).ptr;
  (this->data).d.size = (data->d).size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QHostAddress::QHostAddress(&(this->header).senderAddress);
  QHostAddress::QHostAddress(&(this->header).destinationAddress,dstAddr);
  (this->header).ifindex = 0;
  (this->header).hopLimit = -1;
  (this->header).streamNumber = -1;
  (this->header).senderPort = 0;
  (this->header).destinationPort = port;
  (this->header).endOfRecord = false;
  return;
}

Assistant:

QNetworkDatagramPrivate(const QByteArray &data = QByteArray(),
                            const QHostAddress &dstAddr = QHostAddress(), quint16 port = 0)
        : data(data), header(dstAddr, port)
    {}